

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfsubs.cpp
# Opt level: O1

void __thiscall
icu_63::FractionalPartSubstitution::FractionalPartSubstitution
          (FractionalPartSubstitution *this,int32_t _pos,NFRuleSet *_ruleSet,
          UnicodeString *description,UErrorCode *status)

{
  short sVar1;
  int8_t iVar2;
  int32_t iVar3;
  bool bVar4;
  
  NFSubstitution::NFSubstitution(&this->super_NFSubstitution,_pos,_ruleSet,description,status);
  (this->super_NFSubstitution).super_UObject._vptr_UObject =
       (_func_int **)&PTR__FractionalPartSubstitution_003ab2f8;
  this->byDigits = '\0';
  this->useSpaces = '\x01';
  sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (description->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  iVar2 = UnicodeString::doCompare(description,0,iVar3,L">>",0,2);
  bVar4 = true;
  if (iVar2 != '\0') {
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doCompare(description,0,iVar3,L">>>",0,3);
    if (iVar2 != '\0') {
      bVar4 = (this->super_NFSubstitution).ruleSet == _ruleSet;
    }
  }
  if (bVar4) {
    this->byDigits = '\x01';
    sVar1 = (description->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (description->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    iVar2 = UnicodeString::doCompare(description,0,iVar3,L">>>",0,3);
    if (iVar2 == '\0') {
      this->useSpaces = '\0';
    }
  }
  else {
    ((this->super_NFSubstitution).ruleSet)->fIsFractionRuleSet = '\x01';
  }
  return;
}

Assistant:

FractionalPartSubstitution::FractionalPartSubstitution(int32_t _pos,
                             const NFRuleSet* _ruleSet,
                             const UnicodeString& description,
                             UErrorCode& status)
 : NFSubstitution(_pos, _ruleSet, description, status)
 , byDigits(FALSE)
 , useSpaces(TRUE)

{
    // akk, ruleSet can change in superclass constructor
    if (0 == description.compare(gGreaterGreaterThan, 2) ||
        0 == description.compare(gGreaterGreaterGreaterThan, 3) ||
        _ruleSet == getRuleSet()) {
        byDigits = TRUE;
        if (0 == description.compare(gGreaterGreaterGreaterThan, 3)) {
            useSpaces = FALSE;
        }
    } else {
        // cast away const
        ((NFRuleSet*)getRuleSet())->makeIntoFractionRuleSet();
    }
}